

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O0

void * tommy_tree_remove(tommy_tree *tree,void *data)

{
  tommy_tree_node *ptVar1;
  long in_FS_OFFSET;
  void *data_local;
  tommy_tree *tree_local;
  tommy_tree_node *local_18;
  tommy_tree_node *node;
  
  node = *(tommy_tree_node **)(in_FS_OFFSET + 0x28);
  local_18 = (tommy_tree_node *)0x0;
  ptVar1 = tommy_tree_remove_node(tree->cmp,tree->root,data,&local_18);
  tree->root = ptVar1;
  if (local_18 == (tommy_tree_node *)0x0) {
    tree_local = (tommy_tree *)0x0;
  }
  else {
    tree->count = tree->count - 1;
    tree_local = (tommy_tree *)local_18->data;
  }
  if (*(tommy_tree_node **)(in_FS_OFFSET + 0x28) == node) {
    return tree_local;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_tree_remove(tommy_tree* tree, void* data)
{
	tommy_tree_node* node = 0;

	tree->root = tommy_tree_remove_node(tree->cmp, tree->root, data, &node);

	if (!node)
		return 0;

	--tree->count;

	return node->data;
}